

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_details::xr_scene_details(xr_scene_details *this,xr_scene *scene)

{
  xr_scene *scene_local;
  xr_scene_details *this_local;
  
  xr_scene_part::xr_scene_part
            (&this->super_xr_scene_part,scene,"detail_object.part",SCENE_CHUNK_DETAIL_OBJECTS);
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_details_0038d940;
  this->m_flags = 0x10000000;
  this->m_num_slots = 0;
  this->m_slots = (detail_slot_v3 *)0x0;
  std::vector<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>::vector
            (&this->m_objects);
  std::vector<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>::vector
            (&this->m_indices);
  this->m_density = 0.2;
  std::__cxx11::string::string((string *)&this->m_texture);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_snap_objects);
  (this->m_header).version = 3;
  (this->m_header).object_count = 0;
  (this->m_header).offs_x = 0;
  (this->m_header).offs_z = 0;
  (this->m_header).size_x = 0;
  (this->m_header).size_z = 0;
  return;
}

Assistant:

xr_scene_details::xr_scene_details(xr_scene& scene):
	xr_scene_part(scene, "detail_object.part", SCENE_CHUNK_DETAIL_OBJECTS),
	m_flags(DETMGR_FLAG_DRAW_OBJECTS), m_num_slots(0), m_slots(0),
	m_density(0.2f)
{
	m_header.version = DETMGR_VERSION;
	m_header.object_count = 0;
	m_header.offs_x = 0;
	m_header.offs_z = 0;
	m_header.size_x = 0;
	m_header.size_z = 0;
}